

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

void setup_one_ghash_entry(ptls_fusion_aesgcm_context_t *ctx)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t *psVar9;
  size_t *psVar10;
  ptls_fusion_aesgcm_context_t *ppVar11;
  uint *puVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  ppVar11 = ctx + 1;
  psVar10 = (size_t *)ctx->ghash_cnt;
  if ((ctx->ecb).aesni256 == '\0') {
    pauVar13 = (undefined1 (*) [16])((long)&(ppVar11->ecb).keys + (long)psVar10 * 0x20);
    puVar12 = (uint *)((long)&(ppVar11->ecb).keys + (long)psVar10 * 0x20 + 0x10);
    if (psVar10 != (size_t *)0x0) {
      psVar10 = &ctx->capacity + (long)psVar10 * 4;
    }
  }
  else {
    uVar14 = (ulong)((~(uint)psVar10 & 1) << 4);
    if (psVar10 == (size_t *)0x0) {
      psVar9 = (size_t *)0x0;
    }
    else {
      psVar9 = (size_t *)
               ((long)&(ppVar11->ecb).keys +
               (ulong)((~(uint)(undefined1 *)((long)psVar10 - 1U) & 1) << 4) +
               ((long)psVar10 - 1U & 0x7fffffffffffffe) * 0x20);
    }
    pauVar13 = (undefined1 (*) [16])
               ((long)&(ppVar11->ecb).keys + uVar14 + ((ulong)psVar10 & 0x7fffffffffffffe) * 0x20);
    puVar12 = (uint *)((long)&(ppVar11->ecb).keys +
                      uVar14 + ((ulong)psVar10 & 0x7fffffffffffffe) * 0x20 + 0x20);
    ppVar11 = (ptls_fusion_aesgcm_context_t *)(ctx[1].ecb.keys.m128 + 1);
    psVar10 = psVar9;
  }
  if (psVar10 != (size_t *)0x0) {
    uVar14 = (ppVar11->ecb).keys.m128[0][0];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *psVar10;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar14;
    auVar2 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar3 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar2 = auVar2 ^ auVar5 << uVar1;
      }
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = psVar10[1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (ppVar11->ecb).keys.m128[0][1];
    auVar3 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar15 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar3 = auVar3 ^ auVar16 << uVar1;
      }
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *psVar10 ^ psVar10[1];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar14 ^ (ppVar11->ecb).keys.m128[0][1];
    auVar5 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar4 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar5 = auVar5 ^ auVar6 << uVar1;
      }
    }
    auVar5 = auVar2 ^ auVar3 ^ auVar5;
    auVar16 = vpslldq_avx(auVar5,8);
    auVar15 = vpsrldq_avx(auVar5,8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar2 ^ auVar16,0);
    auVar5 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar5 = auVar5 ^ ZEXT816(0xc200000000000000) << uVar1;
      }
    }
    auVar2 = vpshufd_avx(auVar2 ^ auVar16,0x4e);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB168(auVar5 ^ auVar2,0);
    auVar16 = (undefined1  [16])0x0;
    for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
      if ((auVar8 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
        auVar16 = auVar16 ^ ZEXT816(0xc200000000000000) << uVar1;
      }
    }
    auVar2 = vpshufd_avx(auVar5 ^ auVar2,0x4e);
    *pauVar13 = auVar16 ^ auVar15 ^ auVar2 ^ auVar3;
  }
  auVar2 = *pauVar13;
  auVar3 = vshufps_avx(auVar2,auVar2,0x4e);
  *puVar12 = auVar3._0_4_ ^ auVar2._0_4_;
  puVar12[1] = auVar3._4_4_ ^ auVar2._4_4_;
  puVar12[2] = auVar3._8_4_ ^ auVar2._8_4_;
  puVar12[3] = auVar3._12_4_ ^ auVar2._12_4_;
  ctx->ghash_cnt = ctx->ghash_cnt + 1;
  return;
}

Assistant:

static void setup_one_ghash_entry(ptls_fusion_aesgcm_context_t *ctx)
{
    __m128i *H, *r, *Hprev, H0;

    if (ctx->ecb.aesni256) {
        struct ptls_fusion_aesgcm_context256 *ctx256 = (void *)ctx;
#define GET_SLOT(i, mem) (&ctx256->ghash[(i) / 2].mem[(i) % 2 == 0])
        H = GET_SLOT(ctx->ghash_cnt, H);
        r = GET_SLOT(ctx->ghash_cnt, r);
        Hprev = ctx->ghash_cnt == 0 ? NULL : GET_SLOT(ctx->ghash_cnt - 1, H);
#undef GET_SLOT
        H0 = ctx256->ghash[0].H[1];
    } else {
        struct ptls_fusion_aesgcm_context128 *ctx128 = (void *)ctx;
        H = &ctx128->ghash[ctx->ghash_cnt].H;
        r = &ctx128->ghash[ctx->ghash_cnt].r;
        Hprev = ctx->ghash_cnt == 0 ? NULL : &ctx128->ghash[ctx->ghash_cnt - 1].H;
        H0 = ctx128->ghash[0].H;
    }

    if (Hprev != NULL)
        *H = gfmul(*Hprev, H0);

    *r = _mm_shuffle_epi32(*H, 78);
    *r = _mm_xor_si128(*r, *H);

    ++ctx->ghash_cnt;
}